

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar6;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar7;
  bool bVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  value_type vVar12;
  
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar1 = (((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  pFVar5 = (pFVar4->fadexpr_).right_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar10 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar10 < (int)uVar2) {
    uVar10 = uVar2;
  }
  if ((int)uVar10 < (int)uVar3) {
    uVar10 = uVar3;
  }
  if ((int)uVar10 < (int)uVar1) {
    uVar10 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar10 != uVar1) {
    if (uVar10 == 0) {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar10;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar10) {
        uVar11 = (long)(int)uVar10 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar9;
    }
  }
  if (uVar10 != 0) {
    pdVar9 = (this->dx_).ptr_to_data;
    if (((((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts == 0) ||
       (bVar8 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
                ::hasFastAccess(&((fadexpr->fadexpr_).right_)->fadexpr_), !bVar8)) {
      if (0 < (int)uVar10) {
        uVar11 = 0;
        do {
          vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar11);
          pdVar9[uVar11] = vVar12;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
    }
    else if (0 < (int)uVar10) {
      uVar11 = 0;
      do {
        vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                 ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar11);
        pdVar9[uVar11] = vVar12;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  pFVar6 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar7 = (pFVar4->fadexpr_).right_;
  this->val_ = ((double)(pFVar6->fadexpr_).left_.constant_ * ((pFVar6->fadexpr_).right_)->val_) /
               ((((pFVar7->fadexpr_).left_)->val_ + ((pFVar7->fadexpr_).right_)->val_) *
               (((pFVar5->fadexpr_).left_)->val_ + ((pFVar5->fadexpr_).right_)->val_));
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}